

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O0

unsigned_short sxhash_bitvec(OneDArray *obj)

{
  ushort uVar1;
  uint uVar2;
  DLword *pDVar3;
  ushort *puVar4;
  byte bVar5;
  ushort local_26;
  unsigned_short hash;
  uint bitoffset;
  uint offset;
  uint len;
  unsigned_short *base;
  OneDArray *obj_local;
  
  uVar2 = obj->fillpointer;
  uVar1 = obj->offset;
  pDVar3 = NativeAligned2FromLAddr(*(uint *)obj & 0xfffffff);
  puVar4 = pDVar3 + (uVar1 >> 4);
  if (uVar1 == 0) {
    local_26 = *puVar4;
    if (uVar2 < 0x10) {
      local_26 = (ushort)((int)(uint)local_26 >> (0x10U - (char)uVar2 & 0x1f));
    }
  }
  else {
    bVar5 = (byte)uVar1 & 0xf;
    local_26 = *(short *)((ulong)puVar4 ^ 2) << bVar5 |
               (ushort)((int)(uint)*(ushort *)((ulong)(puVar4 + 1) ^ 2) >> (0x10 - bVar5 & 0x1f));
    if (uVar2 - uVar1 < 0x10) {
      local_26 = (ushort)((int)(uint)local_26 >> (0x10 - ((char)uVar2 - (byte)uVar1) & 0x1f));
    }
  }
  return local_26;
}

Assistant:

static unsigned short sxhash_bitvec(OneDArray *obj) {
  unsigned short *base;
  unsigned len, offset, bitoffset;
  unsigned short hash = 0;
  len = (unsigned)obj->fillpointer;
  offset = (unsigned)obj->offset;
  base = ((unsigned short *)(NativeAligned2FromLAddr(obj->base))) + (offset >> 4);
  if (offset == 0) {
    hash = (*base);
    if (len < 16) hash = hash >> (16 - len);
  } else {
    bitoffset = offset & 15;
    hash = (GETWORD(base++) << (bitoffset));
    hash |= (GETWORD(base) >> (16 - bitoffset));
    if ((len - offset) < 16) hash = hash >> (16 - (len - offset));
  }
  return (hash);
}